

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable-common.h
# Opt level: O1

bool google::sparsehash_internal::write_bigendian_number<_IO_FILE,unsigned_long>
               (_IO_FILE *fp,unsigned_long value,size_t length)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  undefined1 local_39;
  size_t local_38;
  
  bVar6 = length == 0;
  if (!bVar6) {
    local_39 = (char)(value >> ((char)(length - 1) * '\b' & 0x3fU));
    if (7 < length - 1) {
      local_39 = 0;
    }
    sVar2 = fwrite(&local_39,1,1,(FILE *)fp);
    if (sVar2 == 1) {
      uVar4 = length - 2;
      lVar5 = length * 8 + -0x10;
      uVar1 = 1;
      local_38 = length;
      do {
        uVar3 = uVar1;
        if (uVar4 == 0xffffffffffffffff) break;
        local_39 = (undefined1)(value >> ((byte)lVar5 & 0x3f));
        if (7 < uVar4) {
          local_39 = 0;
        }
        sVar2 = fwrite(&local_39,1,1,(FILE *)fp);
        uVar4 = uVar4 - 1;
        lVar5 = lVar5 + -8;
        uVar1 = uVar3 + 1;
      } while (sVar2 == 1);
      bVar6 = local_38 <= uVar3;
    }
  }
  return bVar6;
}

Assistant:

bool write_bigendian_number(OUTPUT* fp, IntType value, size_t length) {
  unsigned char byte;
  // We require IntType to be unsigned or else the shifting gets all screwy.
  static_assert(static_cast<IntType>(-1) > static_cast<IntType>(0),
                "serializing int requires an unsigned type");
  for (size_t i = 0; i < length; ++i) {
    byte = (sizeof(value) <= length - 1 - i)
               ? 0
               : static_cast<unsigned char>((value >> ((length - 1 - i) * 8)) &
                                            255);
    if (!write_data(fp, &byte, sizeof(byte))) return false;
  }
  return true;
}